

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall UnitTestBasehello5::Run(UnitTestBasehello5 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  UnitTestBase *pUVar3;
  Regex r;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  Regex local_50;
  
  bert::Regex::Regex(&local_50,"(a|b|c)*b*");
  bVar2 = bert::Regex::Match(&local_50,"b");
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'r.Match(\"b\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_70,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'r.Match(\"b\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_70,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_50,"bbb");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\'r.Match(\"bbb\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_b0,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\'r.Match(\"bbb\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_b0,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_50,"bbbabc");
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"\'r.Match(\"bbbabc\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_90,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"\'r.Match(\"bbbabc\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_90,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  bVar2 = bert::Regex::Match(&local_50,"");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'r.Match(\"\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_d0,true,false);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'r.Match(\"\")\'","");
    pUVar3 = UnitTestBase::SetInfo(&this->super_UnitTestBase,&local_d0,false,false);
  }
  UnitTestBase::FlushError(pUVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  bert::Regex::~Regex(&local_50);
  return;
}

Assistant:

TEST_CASE(hello5)
{
    Regex r("(a|b|c)*b*");

    EXPECT_TRUE(r.Match("b"));
    EXPECT_TRUE(r.Match("bbb"));
    EXPECT_TRUE(r.Match("bbbabc"));
    EXPECT_TRUE(r.Match(""));
}